

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQUnsignedInteger TranslateIndex(SQObjectPtr *idx)

{
  SQObjectType SVar1;
  SQObjectPtr *idx_local;
  SQTable *local_8;
  
  SVar1 = (idx->super_SQObject)._type;
  if (SVar1 == OT_NULL) {
    local_8 = (SQTable *)0x0;
  }
  else if (SVar1 == OT_INTEGER) {
    local_8 = (idx->super_SQObject)._unVal.pTable;
  }
  else {
    local_8 = (SQTable *)0x0;
  }
  return (SQUnsignedInteger)local_8;
}

Assistant:

SQUnsignedInteger TranslateIndex(const SQObjectPtr &idx)
{
    switch(sq_type(idx)){
        case OT_NULL:
            return 0;
        case OT_INTEGER:
            return (SQUnsignedInteger)_integer(idx);
        default: assert(0); break;
    }
    return 0;
}